

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode trynextip(connectdata *conn,int sockindex,int tempindex)

{
  int sock;
  int iVar1;
  CURLcode CVar2;
  Curl_addrinfo *pCVar3;
  Curl_addrinfo *ai;
  
  sock = conn->tempsock[(uint)tempindex];
  conn->tempsock[(uint)tempindex] = -1;
  CVar2 = CURLE_COULDNT_CONNECT;
  if ((sockindex == 0) &&
     (((pCVar3 = conn->tempaddr[(uint)tempindex], pCVar3 != (Curl_addrinfo *)0x0 ||
       (pCVar3 = conn->tempaddr[0], pCVar3 != (Curl_addrinfo *)0x0)) &&
      (ai = pCVar3->ai_next, ai != (Curl_addrinfo *)0x0)))) {
    iVar1 = pCVar3->ai_family;
    do {
      if (ai->ai_family == iVar1) {
        CVar2 = singleipconnect(conn,ai,conn->tempsock + (uint)tempindex);
        if (CVar2 != CURLE_COULDNT_CONNECT) {
          conn->tempaddr[(uint)tempindex] = ai;
          goto LAB_0054dee7;
        }
      }
      ai = ai->ai_next;
    } while (ai != (Curl_addrinfo *)0x0);
    CVar2 = CURLE_COULDNT_CONNECT;
  }
LAB_0054dee7:
  if (sock != -1) {
    Curl_closesocket(conn,sock);
  }
  return CVar2;
}

Assistant:

static CURLcode trynextip(struct connectdata *conn,
                          int sockindex,
                          int tempindex)
{
  CURLcode rc = CURLE_COULDNT_CONNECT;

  /* First clean up after the failed socket.
     Don't close it yet to ensure that the next IP's socket gets a different
     file descriptor, which can prevent bugs when the curl_multi_socket_action
     interface is used with certain select() replacements such as kqueue. */
  curl_socket_t fd_to_close = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = CURL_SOCKET_BAD;

  if(sockindex == FIRSTSOCKET) {
    Curl_addrinfo *ai = NULL;
    int family = AF_UNSPEC;

    if(conn->tempaddr[tempindex]) {
      /* find next address in the same protocol family */
      family = conn->tempaddr[tempindex]->ai_family;
      ai = conn->tempaddr[tempindex]->ai_next;
    }
    else if(conn->tempaddr[0]) {
      /* happy eyeballs - try the other protocol family */
      int firstfamily = conn->tempaddr[0]->ai_family;
#ifdef ENABLE_IPV6
      family = (firstfamily == AF_INET) ? AF_INET6 : AF_INET;
#else
      family = firstfamily;
#endif
      ai = conn->tempaddr[0]->ai_next;
    }

    while(ai) {
      while(ai && ai->ai_family != family)
        ai = ai->ai_next;

      if(ai) {
        rc = singleipconnect(conn, ai, &conn->tempsock[tempindex]);
        if(rc == CURLE_COULDNT_CONNECT) {
          ai = ai->ai_next;
          continue;
        }
        conn->tempaddr[tempindex] = ai;
      }
      break;
    }
  }

  if(fd_to_close != CURL_SOCKET_BAD)
    Curl_closesocket(conn, fd_to_close);

  return rc;
}